

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdp.cpp
# Opt level: O2

ostream * despot::operator<<(ostream *os,State *state)

{
  ostream *poVar1;
  string local_40 [32];
  
  poVar1 = std::operator<<(os,"(state_id = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,state->state_id);
  std::operator<<(poVar1,", weight = ");
  poVar1 = std::ostream::_M_insert<double>(state->weight);
  poVar1 = std::operator<<(poVar1,", text = ");
  (*state->_vptr_State[2])(local_40,state);
  poVar1 = std::operator<<(poVar1,local_40);
  std::operator<<(poVar1,")");
  std::__cxx11::string::~string(local_40);
  return os;
}

Assistant:

ostream& operator<<(ostream& os, const State& state) {
	os << "(state_id = " << state.state_id << ", weight = " << state.weight
			<< ", text = " << (&state)->text() << ")";
	return os;
}